

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getchainstates(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  _Manager_type in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffa98;
  _Vector_impl_data in_stack_fffffffffffffaa8;
  _Vector_impl_data in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffad8 [16];
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  undefined1 in_stack_fffffffffffffb00 [24];
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  RPCResults local_4d0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_4b8;
  allocator<char> local_492;
  allocator<char> local_491;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  char *local_3b0;
  size_type local_3a8;
  char local_3a0 [8];
  undefined8 uStack_398;
  string local_390 [32];
  string local_370 [32];
  RPCResult local_350;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  RPCResult local_248 [2];
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getchainstates",&local_491);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"\nReturn information about chainstates.\n",&local_492);
  local_4b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4b8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_4d1);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_4d2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_268,"headers",(allocator<char> *)&stack0xfffffffffffffb0f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_288,"the number of headers seen so far",
             (allocator<char> *)&stack0xfffffffffffffb0e);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffa70;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa68;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffa78;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffa80;
  description._M_string_length = in_stack_fffffffffffffa90;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  description.field_2 = in_stack_fffffffffffffa98;
  RPCResult::RPCResult
            (local_248,NUM,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffaa8,
             SUB81(local_268,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"chainstates",(allocator<char> *)&stack0xfffffffffffffae7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c8,
             "list of the chainstates ordered by work, with the most-work (active) chainstate last",
             (allocator<char> *)&stack0xfffffffffffffae6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"",(allocator<char> *)&stack0xfffffffffffffac7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"",(allocator<char> *)&stack0xfffffffffffffac6);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffaa8,
             &RPCHelpForChainstate);
  m_key_name_00._M_string_length = in_stack_fffffffffffffa70;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa68;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffa78;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffffa80;
  description_00._M_string_length = in_stack_fffffffffffffa90;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  description_00.field_2 = in_stack_fffffffffffffa98;
  RPCResult::RPCResult
            (&local_350,OBJ,m_key_name_00,description_00,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffaa8,
             SUB81(local_370,0));
  __l._M_len = 1;
  __l._M_array = &local_350;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffac8,__l,
             (allocator_type *)&stack0xfffffffffffffaa7);
  m_key_name_01._M_string_length = in_stack_fffffffffffffa70;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa68;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffffa78;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffffa80;
  description_01._M_string_length = in_stack_fffffffffffffa90;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  description_01.field_2._M_local_buf = in_stack_fffffffffffffa98._M_local_buf;
  RPCResult::RPCResult
            (local_248 + 1,ARR,m_key_name_01,description_01,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffaa8,
             SUB81(local_2a8,0));
  __l_00._M_len = 2;
  __l_00._M_array = local_248;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb10,__l_00,
             (allocator_type *)&stack0xfffffffffffffaa6);
  m_key_name_02._M_string_length = in_stack_fffffffffffffa70;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa68;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffffa78;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffffa80;
  description_02._M_string_length = in_stack_fffffffffffffa90;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  description_02.field_2 = in_stack_fffffffffffffa98;
  RPCResult::RPCResult
            (&local_f8,OBJ,m_key_name_02,description_02,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffaa8,
             SUB81(local_118,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  result._0_8_ = in_stack_fffffffffffffa68;
  result.m_key_name._M_string_length = in_stack_fffffffffffffa78;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffa80;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffa88;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa90;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffa98;
  result._64_24_ = in_stack_fffffffffffffaa8;
  result._88_24_ = in_stack_fffffffffffffac0;
  result.m_cond._8_16_ = in_stack_fffffffffffffad8;
  result.m_cond.field_2._8_8_ = pRVar2;
  RPCResults::RPCResults(&local_4d0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"getchainstates",(allocator<char> *)&stack0xfffffffffffffaa5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"",(allocator<char> *)&stack0xfffffffffffffaa4);
  HelpExampleCli(&local_3f0,&local_410,&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"getchainstates",(allocator<char> *)&stack0xfffffffffffffaa3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"",(allocator<char> *)&stack0xfffffffffffffaa2);
  HelpExampleRpc(&local_450,&local_470,&local_490);
  std::operator+(&local_3d0,&local_3f0,&local_450);
  local_3b0 = local_3a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p == &local_3d0.field_2) {
    uStack_398 = local_3d0.field_2._8_8_;
  }
  else {
    local_3b0 = local_3d0._M_dataplus._M_p;
  }
  local_3a8 = local_3d0._M_string_length;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:3084:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:3084:9)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffffa98;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar2;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffad8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffad8._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar3;
  fun._8_24_ = in_stack_fffffffffffffb00;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar4;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffa70,&stack0xfffffffffffffa78)),
             description_03,(vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffffaa8,
             (RPCResults)in_stack_fffffffffffffac0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffa78);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_4d0.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb10);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_248[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffac8);
  RPCResult::~RPCResult(&local_350);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffaa8);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffae8);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_4b8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getchainstates()
{
return RPCHelpMan{
        "getchainstates",
        "\nReturn information about chainstates.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::NUM, "headers", "the number of headers seen so far"},
                {RPCResult::Type::ARR, "chainstates", "list of the chainstates ordered by work, with the most-work (active) chainstate last", {{RPCResult::Type::OBJ, "", "", RPCHelpForChainstate},}},
            }
        },
        RPCExamples{
            HelpExampleCli("getchainstates", "")
    + HelpExampleRpc("getchainstates", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    LOCK(cs_main);
    UniValue obj(UniValue::VOBJ);

    ChainstateManager& chainman = EnsureAnyChainman(request.context);

    auto make_chain_data = [&](const Chainstate& cs, bool validated) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        AssertLockHeld(::cs_main);
        UniValue data(UniValue::VOBJ);
        if (!cs.m_chain.Tip()) {
            return data;
        }
        const CChain& chain = cs.m_chain;
        const CBlockIndex* tip = chain.Tip();

        data.pushKV("blocks",                (int)chain.Height());
        data.pushKV("bestblockhash",         tip->GetBlockHash().GetHex());
        data.pushKV("difficulty", GetDifficulty(*tip));
        data.pushKV("verificationprogress",  GuessVerificationProgress(Params().TxData(), tip));
        data.pushKV("coins_db_cache_bytes",  cs.m_coinsdb_cache_size_bytes);
        data.pushKV("coins_tip_cache_bytes", cs.m_coinstip_cache_size_bytes);
        if (cs.m_from_snapshot_blockhash) {
            data.pushKV("snapshot_blockhash", cs.m_from_snapshot_blockhash->ToString());
        }
        data.pushKV("validated", validated);
        return data;
    };

    obj.pushKV("headers", chainman.m_best_header ? chainman.m_best_header->nHeight : -1);

    const auto& chainstates = chainman.GetAll();
    UniValue obj_chainstates{UniValue::VARR};
    for (Chainstate* cs : chainstates) {
      obj_chainstates.push_back(make_chain_data(*cs, !cs->m_from_snapshot_blockhash || chainstates.size() == 1));
    }
    obj.pushKV("chainstates", std::move(obj_chainstates));
    return obj;
}